

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_update.cpp
# Opt level: O2

vector<duckdb::ColumnBinding,_true> * __thiscall
duckdb::LogicalUpdate::GetColumnBindings
          (vector<duckdb::ColumnBinding,_true> *__return_storage_ptr__,LogicalUpdate *this)

{
  idx_t table_idx;
  initializer_list<duckdb::ColumnBinding> __l;
  allocator_type local_39;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  
  if (this->return_chunk == true) {
    table_idx = this->table_index;
    TableCatalogEntry::GetTypes((vector<duckdb::LogicalType,_true> *)&local_38,this->table);
    LogicalOperator::GenerateColumnBindings
              (__return_storage_ptr__,table_idx,
               ((long)local_38.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_38.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
  }
  else {
    local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_38;
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
              (&__return_storage_ptr__->
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,__l,
               &local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ColumnBinding> LogicalUpdate::GetColumnBindings() {
	if (return_chunk) {
		return GenerateColumnBindings(table_index, table.GetTypes().size());
	}
	return {ColumnBinding(0, 0)};
}